

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw.cpp
# Opt level: O0

void ImGui_ImplGlfw_UpdateMousePosAndButtons(void)

{
  int iVar1;
  double mouse_y;
  double mouse_x;
  bool focused;
  ImVec2 mouse_pos_backup;
  int i;
  ImGuiIO *io;
  bool local_39;
  ImVec2 local_38;
  double local_30;
  double local_28;
  undefined1 local_1d;
  ImVec2 local_1c;
  ImVec2 local_14;
  int local_c;
  ImGuiIO *local_8;
  
  local_8 = ImGui::GetIO();
  for (local_c = 0; local_c < 5; local_c = local_c + 1) {
    local_39 = true;
    if ((g_MouseJustPressed[local_c] & 1U) == 0) {
      iVar1 = glfwGetMouseButton(g_Window,local_c);
      local_39 = iVar1 != 0;
    }
    local_8->MouseDown[local_c] = local_39;
    g_MouseJustPressed[local_c] = false;
  }
  local_14 = local_8->MousePos;
  ImVec2::ImVec2(&local_1c,-3.4028235e+38,-3.4028235e+38);
  local_8->MousePos = local_1c;
  iVar1 = glfwGetWindowAttrib(g_Window,0x20001);
  local_1d = iVar1 != 0;
  if ((bool)local_1d) {
    if ((local_8->WantSetMousePos & 1U) == 0) {
      glfwGetCursorPos(g_Window,&local_28,&local_30);
      ImVec2::ImVec2(&local_38,(float)local_28,(float)local_30);
      local_8->MousePos = local_38;
    }
    else {
      glfwSetCursorPos(g_Window,(double)local_14.x,(double)local_14.y);
    }
  }
  return;
}

Assistant:

static void ImGui_ImplGlfw_UpdateMousePosAndButtons()
{
    // Update buttons
    ImGuiIO& io = ImGui::GetIO();
    for (int i = 0; i < IM_ARRAYSIZE(io.MouseDown); i++)
    {
        // If a mouse press event came, always pass it as "mouse held this frame", so we don't miss click-release events that are shorter than 1 frame.
        io.MouseDown[i] = g_MouseJustPressed[i] || glfwGetMouseButton(g_Window, i) != 0;
        g_MouseJustPressed[i] = false;
    }

    // Update mouse position
    const ImVec2 mouse_pos_backup = io.MousePos;
    io.MousePos = ImVec2(-FLT_MAX, -FLT_MAX);
#ifdef __EMSCRIPTEN__
    const bool focused = true; // Emscripten
#else
    const bool focused = glfwGetWindowAttrib(g_Window, GLFW_FOCUSED) != 0;
#endif
    if (focused)
    {
        if (io.WantSetMousePos)
        {
            glfwSetCursorPos(g_Window, (double)mouse_pos_backup.x, (double)mouse_pos_backup.y);
        }
        else
        {
            double mouse_x, mouse_y;
            glfwGetCursorPos(g_Window, &mouse_x, &mouse_y);
            io.MousePos = ImVec2((float)mouse_x, (float)mouse_y);
        }
    }
}